

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-mltpctive-dynamical-system.cpp
# Opt level: O1

void __thiscall
stateObservation::IMUMltpctiveDynamicalSystem::stateDifference
          (IMUMltpctiveDynamicalSystem *this,Vector *stateVector1,Vector *stateVector2,
          Vector *difference)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  PointerType ptr;
  double *pdVar10;
  undefined8 *puVar11;
  char *__function;
  undefined1 auVar12 [16];
  double dVar13;
  Packet2d b_zw;
  double dVar14;
  undefined1 auVar15 [16];
  AngleAxis aa;
  Quaternion<double,_0> res;
  AngleAxis<double> local_58;
  double local_38;
  double dStack_30;
  double local_28;
  double dStack_20;
  
  if ((difference->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
      != 0x12) {
    free((difference->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
         m_data);
    pdVar10 = (double *)malloc(0x90);
    if (((ulong)pdVar10 & 0xf) != 0) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pdVar10 == (double *)0x0) {
      puVar11 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar11 = operator_delete;
      __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    (difference->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
         pdVar10;
  }
  (difference->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows =
       0x12;
  if ((2 < (stateVector1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
           m_rows) &&
     (2 < (stateVector2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
          m_rows)) {
    pdVar10 = (stateVector1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
              m_storage.m_data;
    pdVar1 = (stateVector2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
             m_storage.m_data;
    pdVar2 = (difference->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
             m_data;
    dVar3 = pdVar10[1];
    dVar4 = pdVar1[1];
    *pdVar2 = *pdVar10 - *pdVar1;
    pdVar2[1] = dVar3 - dVar4;
    pdVar2[2] = pdVar10[2] - pdVar1[2];
    if ((9 < (stateVector1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
             m_storage.m_rows) &&
       (9 < (stateVector2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
            .m_rows)) {
      if (8 < (difference->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
              .m_rows) {
        pdVar10 = (stateVector1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_data;
        pdVar1 = (stateVector2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        pdVar2 = (difference->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_data;
        dVar3 = pdVar10[8];
        dVar4 = pdVar1[8];
        pdVar2[6] = pdVar10[7] - pdVar1[7];
        pdVar2[7] = dVar3 - dVar4;
        pdVar2[8] = pdVar10[9] - pdVar1[9];
        if (((stateVector1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
             m_storage.m_rows < 0x10) ||
           ((stateVector2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage
            .m_rows < 0x10)) goto LAB_0014954b;
        if (0xe < (difference->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_rows) {
          pdVar10 = (stateVector1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          pdVar1 = (stateVector2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
          pdVar2 = (difference->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
          dVar3 = pdVar10[0xe];
          dVar4 = pdVar1[0xe];
          pdVar2[0xc] = pdVar10[0xd] - pdVar1[0xd];
          pdVar2[0xd] = dVar3 - dVar4;
          pdVar2[0xe] = pdVar10[0xf] - pdVar1[0xf];
          if (((stateVector1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
               m_storage.m_rows < 7) ||
             ((stateVector2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
              m_storage.m_rows < 7)) {
            __function = 
            "Eigen::Block<const Eigen::Matrix<double, -1, 1>, 4, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = 4, BlockCols = 1, InnerPanel = false]"
            ;
            goto LAB_0014958e;
          }
          pdVar10 = (stateVector2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                    m_storage.m_data;
          pdVar1 = (stateVector1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_data;
          dVar3 = pdVar1[3];
          dVar4 = pdVar1[4];
          dVar5 = pdVar1[5];
          dVar6 = pdVar1[6];
          dVar7 = pdVar10[3];
          dVar8 = pdVar10[4];
          dVar9 = pdVar10[6];
          dVar13 = -pdVar10[5];
          dVar14 = -dVar7 * dVar5 - dVar3 * dVar13;
          auVar15._8_4_ = SUB84(dVar14,0);
          auVar15._0_8_ = -dVar8 * dVar5 - dVar3 * dVar9;
          auVar15._12_4_ = (int)((ulong)dVar14 >> 0x20);
          local_38 = SUB168(auVar15 ^ _DAT_00199020,0) + (dVar4 * dVar13 - dVar6 * dVar7);
          dStack_30 = SUB168(auVar15 ^ _DAT_00199020,8) + (dVar4 * dVar9 - dVar6 * dVar8);
          dVar14 = dVar5 * dVar13 - dVar3 * dVar7;
          auVar12._8_4_ = SUB84(dVar14,0);
          auVar12._0_8_ = dVar5 * dVar9 - dVar3 * dVar8;
          auVar12._12_4_ = (int)((ulong)dVar14 >> 0x20);
          local_28 = SUB168(auVar12 ^ _DAT_00199030,0) + dVar4 * dVar7 + dVar6 * dVar13;
          dStack_20 = SUB168(auVar12 ^ _DAT_00199030,8) + dVar4 * dVar8 + dVar6 * dVar9;
          Eigen::AngleAxis<double>::operator=
                    (&local_58,(QuaternionBase<Eigen::Quaternion<double,_0>_> *)&local_38);
          if (5 < (difference->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_rows) {
            pdVar10 = (difference->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_data;
            pdVar10[3] = local_58.m_angle *
                         local_58.m_axis.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array[0];
            pdVar10[4] = local_58.m_angle *
                         local_58.m_axis.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array[1];
            pdVar10[5] = local_58.m_axis.
                         super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                         m_data.array[2] * local_58.m_angle;
            if (((stateVector1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                 m_storage.m_rows < 0xd) ||
               ((stateVector2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                m_storage.m_rows < 0xd)) goto LAB_0014954b;
            if (0xb < (difference->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                      m_storage.m_rows) {
              pdVar10 = (stateVector1->
                        super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                        m_data;
              pdVar1 = (stateVector2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                       ).m_storage.m_data;
              pdVar2 = (difference->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                       m_storage.m_data;
              dVar3 = pdVar10[0xb];
              dVar4 = pdVar1[0xb];
              pdVar2[9] = pdVar10[10] - pdVar1[10];
              pdVar2[10] = dVar3 - dVar4;
              pdVar2[0xb] = pdVar10[0xc] - pdVar1[0xc];
              if (((stateVector1->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                   m_storage.m_rows < 0x13) ||
                 ((stateVector2->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).
                  m_storage.m_rows < 0x13)) goto LAB_0014954b;
              if (0x11 < (difference->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                         ).m_storage.m_rows) {
                pdVar10 = (stateVector1->
                          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                          m_data;
                pdVar1 = (stateVector2->
                         super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                         m_data;
                pdVar2 = (difference->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
                         ).m_storage.m_data;
                dVar3 = pdVar10[0x11];
                dVar4 = pdVar1[0x11];
                pdVar2[0xf] = pdVar10[0x10] - pdVar1[0x10];
                pdVar2[0x10] = dVar3 - dVar4;
                pdVar2[0x11] = pdVar10[0x12] - pdVar1[0x12];
                return;
              }
            }
          }
        }
      }
      __function = 
      "Eigen::Block<Eigen::Matrix<double, -1, 1>, 3, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
      ;
      goto LAB_0014958e;
    }
  }
LAB_0014954b:
  __function = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, 3, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = 3, BlockCols = 1, InnerPanel = false]"
  ;
LAB_0014958e:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

void IMUMltpctiveDynamicalSystem::stateDifference(const Vector & stateVector1,
                                                  const Vector & stateVector2,
                                                  Vector & difference)
{
  difference.resize(indexesTangent::size);
  difference.segment<3>(indexesTangent::pos) =
      stateVector1.segment<3>(indexes::pos) - stateVector2.segment<3>(indexes::pos);
  difference.segment<3>(indexesTangent::linVel) =
      stateVector1.segment<3>(indexes::linVel) - stateVector2.segment<3>(indexes::linVel);
  difference.segment<3>(indexesTangent::linAcc) =
      stateVector1.segment<3>(indexes::linAcc) - stateVector2.segment<3>(indexes::linAcc);

  difference.segment<3>(indexesTangent::ori) =
      kine::quaternionToRotationVector(Quaternion(stateVector1.segment<4>(indexes::ori))
                                       * Quaternion(stateVector2.segment<4>(indexes::ori)).conjugate());
  difference.segment<3>(indexesTangent::angVel) =
      stateVector1.segment<3>(indexes::angVel) - stateVector2.segment<3>(indexes::angVel);
  difference.segment<3>(indexesTangent::angAcc) =
      stateVector1.segment<3>(indexes::angAcc) - stateVector2.segment<3>(indexes::angAcc);
}